

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

void stbtt_MakeGlyphBitmapSubpixel
               (stbtt_fontinfo *info,uchar *output,int out_w,int out_h,int out_stride,float scale_x,
               float scale_y,float shift_x,float shift_y,int glyph)

{
  undefined1 local_68 [8];
  stbtt__bitmap gbm;
  stbtt_vertex *psStack_48;
  int num_verts;
  stbtt_vertex *vertices;
  int iy0;
  int ix0;
  int glyph_local;
  float shift_y_local;
  float shift_x_local;
  float scale_y_local;
  float scale_x_local;
  int out_stride_local;
  int out_h_local;
  int out_w_local;
  uchar *output_local;
  stbtt_fontinfo *info_local;
  
  iy0 = glyph;
  ix0 = (int)shift_y;
  glyph_local = (int)shift_x;
  shift_y_local = scale_y;
  shift_x_local = scale_x;
  scale_y_local = (float)out_stride;
  scale_x_local = (float)out_h;
  out_stride_local = out_w;
  _out_h_local = output;
  output_local = (uchar *)info;
  gbm.pixels._4_4_ = stbtt_GetGlyphShape(info,glyph,&stack0xffffffffffffffb8);
  stbtt_GetGlyphBitmapBoxSubpixel
            ((stbtt_fontinfo *)output_local,iy0,shift_x_local,shift_y_local,(float)glyph_local,
             (float)ix0,(int *)((long)&vertices + 4),(int *)&vertices,(int *)0x0,(int *)0x0);
  gbm._8_8_ = _out_h_local;
  local_68._0_4_ = out_stride_local;
  local_68._4_4_ = scale_x_local;
  gbm.w = (int)scale_y_local;
  if ((out_stride_local != 0) && (scale_x_local != 0.0)) {
    stbtt_Rasterize((stbtt__bitmap *)local_68,0.35,psStack_48,gbm.pixels._4_4_,shift_x_local,
                    shift_y_local,(float)glyph_local,(float)ix0,vertices._4_4_,(int)vertices,1,
                    *(void **)output_local);
  }
  free(psStack_48);
  return;
}

Assistant:

STBTT_DEF void stbtt_MakeGlyphBitmapSubpixel(const stbtt_fontinfo *info, unsigned char *output, int out_w, int out_h, int out_stride, float scale_x, float scale_y, float shift_x, float shift_y, int glyph)
{
   int ix0,iy0;
   stbtt_vertex *vertices;
   int num_verts = stbtt_GetGlyphShape(info, glyph, &vertices);
   stbtt__bitmap gbm;

   stbtt_GetGlyphBitmapBoxSubpixel(info, glyph, scale_x, scale_y, shift_x, shift_y, &ix0,&iy0,0,0);
   gbm.pixels = output;
   gbm.w = out_w;
   gbm.h = out_h;
   gbm.stride = out_stride;

   if (gbm.w && gbm.h)
      stbtt_Rasterize(&gbm, 0.35f, vertices, num_verts, scale_x, scale_y, shift_x, shift_y, ix0,iy0, 1, info->userdata);

   STBTT_free(vertices, info->userdata);
}